

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_bKGD(ucvector *out,LodePNGInfo *info)

{
  size_t __size;
  uchar uVar1;
  uint uVar2;
  uint extraout_EAX;
  uchar *data;
  uchar *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  size_t sVar6;
  
  data = (uchar *)0x0;
  uVar9 = 0;
  switch((info->color).colortype) {
  case LCT_GREY:
  case LCT_GREY_ALPHA:
    uVar2 = info->background_r;
    data = (uchar *)malloc(1);
    if (data != (uchar *)0x0) {
      *data = (uchar)(uVar2 >> 8);
    }
    uVar8 = (ulong)(data != (uchar *)0x0);
    puVar3 = (uchar *)realloc(data,uVar8 * 2 + 1);
    uVar9 = uVar8;
    if (puVar3 != (uchar *)0x0) {
      uVar9 = uVar8 + 1;
      puVar3[uVar8] = (uchar)uVar2;
      data = puVar3;
    }
    break;
  case LCT_RGB:
  case LCT_RGBA:
    uVar2 = info->background_r;
    data = (uchar *)malloc(1);
    bVar10 = data != (uchar *)0x0;
    if (bVar10) {
      *data = (uchar)(uVar2 >> 8);
    }
    uVar9 = (ulong)bVar10;
    __size = uVar9 + 1 + uVar9;
    puVar3 = (uchar *)realloc(data,__size);
    sVar6 = (ulong)bVar10;
    if (puVar3 != (uchar *)0x0) {
      puVar3[uVar9] = (uchar)uVar2;
      uVar9 = uVar9 + 1;
      sVar6 = __size;
      data = puVar3;
    }
    uVar1 = *(uchar *)((long)&info->background_g + 1);
    uVar8 = uVar9 + 1;
    if ((uint)uVar9 < (uint)sVar6) {
      bVar10 = false;
    }
    else {
      uVar4 = 0;
      if ((uint)uVar9 < (uint)sVar6 * 2) {
        uVar4 = uVar8 >> 1;
      }
      puVar3 = (uchar *)realloc(data,uVar4 + uVar8);
      bVar10 = puVar3 == (uchar *)0x0;
      if (!bVar10) {
        data = puVar3;
        sVar6 = uVar4 + uVar8;
      }
    }
    if (!bVar10) {
      data[uVar9] = uVar1;
      uVar9 = uVar8;
    }
    uVar2 = info->background_g;
    uVar8 = uVar9 + 1;
    if ((uint)uVar9 < (uint)sVar6) {
      bVar10 = false;
    }
    else {
      uVar4 = 0;
      if ((uint)uVar9 < (uint)sVar6 * 2) {
        uVar4 = uVar8 >> 1;
      }
      puVar3 = (uchar *)realloc(data,uVar4 + uVar8);
      bVar10 = puVar3 == (uchar *)0x0;
      if (!bVar10) {
        data = puVar3;
        sVar6 = uVar4 + uVar8;
      }
    }
    uVar5 = (uint)sVar6;
    if (!bVar10) {
      data[uVar9] = (uchar)uVar2;
      uVar9 = uVar8;
    }
    uVar1 = *(uchar *)((long)&info->background_b + 1);
    uVar8 = uVar9 + 1;
    uVar2 = (uint)uVar8;
    if (uVar5 < uVar2) {
      uVar4 = (ulong)(uVar2 * 3 >> 1);
      if (uVar5 * 2 < uVar2) {
        uVar4 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar4);
      bVar10 = puVar3 == (uchar *)0x0;
      if (!bVar10) {
        data = puVar3;
        sVar6 = uVar4;
      }
      uVar5 = (uint)sVar6;
    }
    else {
      bVar10 = false;
    }
    if (!bVar10) {
      data[uVar9] = uVar1;
      uVar9 = uVar8;
    }
    uVar2 = info->background_b;
    uVar8 = uVar9 + 1;
    uVar7 = (uint)uVar8;
    if (uVar5 < uVar7) {
      uVar4 = (ulong)(uVar7 * 3 >> 1);
      if (uVar5 * 2 < uVar7) {
        uVar4 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar4);
      bVar10 = puVar3 == (uchar *)0x0;
      if (!bVar10) {
        data = puVar3;
      }
    }
    else {
      bVar10 = false;
    }
    if (!bVar10) {
      data[uVar9] = (uchar)uVar2;
      uVar9 = uVar8;
    }
    break;
  case LCT_PALETTE:
    uVar2 = info->background_r;
    uVar9 = 1;
    data = (uchar *)malloc(1);
    if (data == (uchar *)0x0) {
      uVar9 = 0;
    }
    else {
      *data = (uchar)uVar2;
    }
  }
  uVar2 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar9,"bKGD",data);
  if (uVar2 == 0) {
    out->allocsize = out->size;
  }
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_bKGD(ucvector* out, const LodePNGInfo* info)
{
	unsigned error = 0;
	ucvector bKGD;
	ucvector_init(&bKGD);
	if (info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA)
	{
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r & 255));
	}
	else if (info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA)
	{
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r & 255));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_g >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_g & 255));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_b >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_b & 255));
	}
	else if (info->color.colortype == LCT_PALETTE)
	{
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r & 255)); /*palette index*/
	}

	error = addChunk(out, "bKGD", bKGD.data, bKGD.size);
	ucvector_cleanup(&bKGD);

	return error;
}